

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_parser_parseExpressionListUntil
          (sysbvm_context_t *context,sysbvm_parser_state_t *state,sysbvm_tokenKind_t delimiter)

{
  int iVar1;
  sysbvm_tokenKind_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t element;
  
  sVar3 = sysbvm_orderedCollection_create(context);
  while ((iVar1 = sysbvm_parser_lookKindAt(state,0), -1 < iVar1 &&
         (sVar2 = sysbvm_parser_lookKindAt(state,0), sVar2 != delimiter))) {
    while (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x18) {
      state->tokenPosition = state->tokenPosition + 1;
    }
    element = sysbvm_parser_parseCommaExpression(context,state);
    if (element == 0) break;
    sysbvm_orderedCollection_add(context,sVar3,element);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 0x18) break;
    while (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x18) {
      state->tokenPosition = state->tokenPosition + 1;
    }
  }
  sVar3 = sysbvm_orderedCollection_asArray(context,sVar3);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseExpressionListUntil(sysbvm_context_t *context, sysbvm_parser_state_t *state, sysbvm_tokenKind_t delimiter)
{
    sysbvm_tuple_t expressionOrderedCollection = sysbvm_orderedCollection_create(context);

    // Parse the expressions on the sequence.
    while(sysbvm_parser_lookKindAt(state, 0) >= 0 && sysbvm_parser_lookKindAt(state, 0) != (int)delimiter)
    {
        // Skip the dots at the beginning
        while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_DOT)
            ++state->tokenPosition;

        sysbvm_tuple_t expression = sysbvm_parser_parseExpression(context, state);
        if(SYSBVM_NULL_TUPLE == expression)
            break;

        sysbvm_orderedCollection_add(context, expressionOrderedCollection, expression);

        // We need at least a single dot before the next expression.
        if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_DOT)
            break;

        // Skip the extra dots.
        while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_DOT)
            ++state->tokenPosition;
    }

    return sysbvm_orderedCollection_asArray(context, expressionOrderedCollection);
}